

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StartMulticastSender.h
# Opt level: O0

bool __thiscall
ViconCGStream::VStartMulticastSender::Read(VStartMulticastSender *this,VBuffer *i_rBuffer)

{
  bool bVar1;
  bool local_19;
  VBuffer *i_rBuffer_local;
  VStartMulticastSender *this_local;
  
  bVar1 = ViconCGStreamIO::VBuffer::Read<unsigned_int>(i_rBuffer,&this->m_MulticastIpAddress);
  local_19 = false;
  if (bVar1) {
    bVar1 = ViconCGStreamIO::VBuffer::Read<unsigned_int>(i_rBuffer,&this->m_SourceIpAddress);
    local_19 = false;
    if (bVar1) {
      local_19 = ViconCGStreamIO::VBuffer::Read<unsigned_short>(i_rBuffer,&this->m_Port);
    }
  }
  return local_19;
}

Assistant:

virtual bool Read( const ViconCGStreamIO::VBuffer & i_rBuffer )
  {
    return i_rBuffer.Read( m_MulticastIpAddress )
        && i_rBuffer.Read( m_SourceIpAddress )
        && i_rBuffer.Read( m_Port );
  }